

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::TestEventRepeater::OnTestIterationEnd
          (TestEventRepeater *this,UnitTest *unit_test,int iteration)

{
  size_type sVar1;
  reference ppTVar2;
  uint in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  int i;
  int local_18;
  
  if ((*(byte *)(in_RDI + 8) & 1) != 0) {
    sVar1 = std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
            ::size((vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                    *)(in_RDI + 0x10));
    local_18 = (int)sVar1;
    while (local_18 = local_18 + -1, -1 < local_18) {
      ppTVar2 = std::
                vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                ::operator[]((vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                              *)(in_RDI + 0x10),(long)local_18);
      (*(*ppTVar2)->_vptr_TestEventListener[0xd])(*ppTVar2,in_RSI,(ulong)in_EDX);
    }
  }
  return;
}

Assistant:

void TestEventRepeater::OnTestIterationEnd(const UnitTest& unit_test,
                                           int iteration) {
  if (forwarding_enabled_) {
    for (int i = static_cast<int>(listeners_.size()) - 1; i >= 0; i--) {
      listeners_[i]->OnTestIterationEnd(unit_test, iteration);
    }
  }
}